

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.hh
# Opt level: O1

bool __thiscall
kratos::InterfaceModPortDefinition::has_port(InterfaceModPortDefinition *this,string *name)

{
  const_iterator cVar1;
  bool bVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->inputs_)._M_t,name);
  bVar2 = true;
  if ((_Rb_tree_header *)cVar1._M_node == &(this->inputs_)._M_t._M_impl.super__Rb_tree_header) {
    cVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->outputs_)._M_t,name);
    bVar2 = (_Rb_tree_header *)cVar1._M_node != &(this->outputs_)._M_t._M_impl.super__Rb_tree_header
    ;
  }
  return bVar2;
}

Assistant:

[[nodiscard]] bool has_port(const std::string &name) const override {
        return inputs_.find(name) != inputs_.end() || outputs_.find(name) != outputs_.end();
    }